

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAArhsQ(sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector resvalQB,void *ida_mem)

{
  long lVar1;
  long lVar2;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  IDAMem in_XMM0_Qa;
  int flag;
  int retval;
  IDABMem IDAB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  int local_50;
  int local_4c;
  
  lVar1 = *(long *)(in_RCX + 0x840);
  lVar2 = *(long *)(lVar1 + 0x40);
  if (*(int *)(lVar1 + 0xc0) == 0) {
    if (*(int *)(lVar1 + 0xbc) == 0) {
      local_50 = (**(code **)(lVar1 + 0x98))
                           (in_XMM0_Qa,in_RCX,*(undefined8 *)(lVar1 + 0x158),
                            *(undefined8 *)(lVar1 + 0x160),0);
    }
    else {
      local_50 = (**(code **)(lVar1 + 0x98))
                           (in_XMM0_Qa,in_RCX,*(undefined8 *)(lVar1 + 0x158),
                            *(undefined8 *)(lVar1 + 0x160),*(undefined8 *)(lVar1 + 0x168),
                            *(undefined8 *)(lVar1 + 0x170));
    }
    if (local_50 != 0) {
      IDAProcessError(in_XMM0_Qa,(int)in_RCX,-1,(char *)0xee6,"IDAArhsQ",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"Bad t = %.15g for interpolation.");
      return -1;
    }
  }
  if (*(int *)(lVar2 + 0x1c) == 0) {
    local_4c = (**(code **)(lVar2 + 0x30))
                         (in_XMM0_Qa,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),
                          in_RDI,in_RSI,in_RDX,*(undefined8 *)(lVar2 + 0x40));
  }
  else {
    local_4c = (**(code **)(lVar2 + 0x38))
                         (in_XMM0_Qa,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),
                          *(undefined8 *)(lVar1 + 0x168),*(undefined8 *)(lVar1 + 0x170),in_RDI,
                          in_RSI,in_RDX,*(undefined8 *)(lVar2 + 0x40));
  }
  return local_4c;
}

Assistant:

static int IDAArhsQ(sunrealtype tt, N_Vector yyB, N_Vector ypB,
                    N_Vector resvalQB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  int retval, flag;

  IDA_mem    = (IDAMem)ida_mem;
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Get current backward problem. */
  IDAB_mem = IDAADJ_mem->ia_bckpbCrt;

  retval = IDA_SUCCESS;

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    if (IDAADJ_mem->ia_interpSensi)
    {
      flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, IDAADJ_mem->ia_yySTmp,
                                 IDAADJ_mem->ia_ypSTmp);
    }
    else
    {
      flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, NULL, NULL);
    }

    if (flag != IDA_SUCCESS)
    {
      IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSGAM_BAD_TINTERP, tt);
      return (-1);
    }
  }

  /* Call user's adjoint quadrature RHS routine */
  if (IDAB_mem->ida_rhsQ_withSensi)
  {
    retval = IDAB_mem->ida_rhsQS(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                                 IDAADJ_mem->ia_yySTmp, IDAADJ_mem->ia_ypSTmp,
                                 yyB, ypB, resvalQB, IDAB_mem->ida_user_data);
  }
  else
  {
    retval = IDAB_mem->ida_rhsQ(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                                yyB, ypB, resvalQB, IDAB_mem->ida_user_data);
  }
  return (retval);
}